

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# generator.cpp
# Opt level: O1

bool __thiscall
libcellml::Generator::GeneratorImpl::isAndOperator(GeneratorImpl *this,AnalyserEquationAstPtr *ast)

{
  bool bVar1;
  Type TVar2;
  
  TVar2 = AnalyserEquationAst::type
                    ((ast->
                     super___shared_ptr<libcellml::AnalyserEquationAst,_(__gnu_cxx::_Lock_policy)2>)
                     ._M_ptr);
  if (TVar2 == AND) {
    bVar1 = GeneratorProfile::hasAndOperator
                      ((this->mProfile).
                       super___shared_ptr<libcellml::GeneratorProfile,_(__gnu_cxx::_Lock_policy)2>.
                       _M_ptr);
    return bVar1;
  }
  return false;
}

Assistant:

bool Generator::GeneratorImpl::isAndOperator(const AnalyserEquationAstPtr &ast) const
{
    return (ast->type() == AnalyserEquationAst::Type::AND)
           && mProfile->hasAndOperator();
}